

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_igsdb_shading_layer_json.unit.cpp
# Opt level: O0

void __thiscall
TestLoadIGSDBJSONFromDisk_TestLoadIGSDBPerforatedScreenShadingLayerJSON_Test::TestBody
          (TestLoadIGSDBJSONFromDisk_TestLoadIGSDBPerforatedScreenShadingLayerJSON_Test *this)

{
  bool bVar1;
  char *pcVar2;
  element_type *peVar3;
  element_type *peVar4;
  variant<std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>,_OpticsParser::DualBandBSDF>
  *__v;
  reference pvVar5;
  MeasurementComponent *pMVar6;
  AssertHelper local_ea8;
  Message local_ea0;
  double local_e98;
  undefined1 local_e90 [8];
  AssertionResult gtest_ar_30;
  Message local_e78;
  double local_e70;
  undefined1 local_e68 [8];
  AssertionResult gtest_ar_29;
  Message local_e50;
  double local_e48;
  undefined1 local_e40 [8];
  AssertionResult gtest_ar_28;
  Message local_e28;
  double local_e20;
  undefined1 local_e18 [8];
  AssertionResult gtest_ar_27;
  Message local_e00;
  double local_df8;
  undefined1 local_df0 [8];
  AssertionResult gtest_ar_26;
  Message local_dd8;
  double local_dd0;
  undefined1 local_dc8 [8];
  AssertionResult gtest_ar_25;
  Message local_db0;
  double local_da8;
  undefined1 local_da0 [8];
  AssertionResult gtest_ar_24;
  Message local_d88;
  double local_d80;
  undefined1 local_d78 [8];
  AssertionResult gtest_ar_23;
  Message local_d60;
  int local_d54;
  size_type local_d50;
  undefined1 local_d48 [8];
  AssertionResult gtest_ar_22;
  vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_> *materialMeasurements;
  Message local_d28;
  bool local_d1a;
  bool local_d19;
  undefined1 local_d18 [8];
  AssertionResult gtest_ar_21;
  Message local_d00;
  double local_cf8;
  undefined1 local_cf0 [8];
  AssertionResult gtest_ar_20;
  Message local_cd8;
  double local_cd0;
  undefined1 local_cc8 [8];
  AssertionResult gtest_ar_19;
  Message local_cb0;
  double local_ca8;
  undefined1 local_ca0 [8];
  AssertionResult gtest_ar_18;
  Message local_c88;
  double local_c80;
  undefined1 local_c78 [8];
  AssertionResult gtest_ar_17;
  Message local_c60;
  double local_c58;
  undefined1 local_c50 [8];
  AssertionResult gtest_ar_16;
  Message local_c38;
  undefined1 local_c30 [8];
  AssertionResult gtest_ar_15;
  Message local_c18;
  undefined1 local_c10 [8];
  AssertionResult gtest_ar_14;
  Message local_bf8;
  undefined1 local_bf0 [8];
  AssertionResult gtest_ar_13;
  shared_ptr<OpticsParser::ProductData> material;
  Message local_bc8;
  undefined1 local_bc0 [8];
  AssertionResult gtest_ar_12;
  Message local_ba8;
  double local_ba0;
  undefined1 local_b98 [8];
  AssertionResult gtest_ar_11;
  Message local_b80;
  double local_b78;
  undefined1 local_b70 [8];
  AssertionResult gtest_ar_10;
  Message local_b58;
  double local_b50;
  undefined1 local_b48 [8];
  AssertionResult gtest_ar_9;
  Message local_b30;
  double local_b28;
  undefined1 local_b20 [8];
  AssertionResult gtest_ar_8;
  shared_ptr<OpticsParser::PerforatedGeometry> geometry;
  Message local_af8;
  bool local_aea;
  bool local_ae9;
  undefined1 local_ae8 [8];
  AssertionResult gtest_ar_7;
  Message local_ad0;
  optional<double> local_ac8;
  undefined1 local_ab8 [8];
  AssertionResult gtest_ar_6;
  Message local_aa0;
  optional<double> local_a98;
  undefined1 local_a88 [8];
  AssertionResult gtest_ar_5;
  Message local_a70;
  optional<double> local_a68;
  undefined1 local_a58 [8];
  AssertionResult gtest_ar_4;
  Message local_a40;
  optional<double> local_a38;
  undefined1 local_a28 [8];
  AssertionResult gtest_ar_3;
  Message local_a10;
  undefined1 local_a08 [8];
  AssertionResult gtest_ar_2;
  Message local_9f0;
  undefined1 local_9e8 [8];
  AssertionResult gtest_ar_1;
  Message local_9d0;
  undefined1 local_9c8 [8];
  AssertionResult gtest_ar;
  undefined1 local_998 [8];
  ProductData product;
  Parser parser;
  undefined1 local_40 [8];
  path product_path;
  ScopedTrace gtest_trace_60;
  TestLoadIGSDBJSONFromDisk_TestLoadIGSDBPerforatedScreenShadingLayerJSON_Test *this_local;
  
  testing::ScopedTrace::ScopedTrace
            ((ScopedTrace *)&product_path.field_0x27,
             "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
             ,0x3c,"Begin Test: Load IGSDB perforated shading layer json format.");
  std::filesystem::__cxx11::path::path<char[96],std::filesystem::__cxx11::path>
            ((path *)local_40,
             (char (*) [96])
             "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test"
             ,auto_format);
  std::filesystem::__cxx11::path::operator/=((path *)local_40,(char (*) [9])0x242623);
  std::filesystem::__cxx11::path::operator/=
            ((path *)local_40,(char (*) [25])"igsdb_v1_perforated.json");
  std::filesystem::__cxx11::path::string((string *)&gtest_ar.message_,(path *)local_40);
  OpticsParser::Parser::parseJSONFile
            ((ProductData *)local_998,
             (Parser *)
             &product.deviceType.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .field_0x23,(string *)&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[30],_nullptr>
            ((EqHelper *)local_9c8,"product.name","\"Solar Comfort Radiant Barrier\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &product.super_enable_shared_from_this<OpticsParser::ProductData>._M_weak_this.
              super___weak_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (char (*) [30])"Solar Comfort Radiant Barrier");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9c8);
  if (!bVar1) {
    testing::Message::Message(&local_9d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_9c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x46,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_9d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_9d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9c8);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[8],_nullptr>
            ((EqHelper *)local_9e8,"product.productType","\"shading\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &product.productName.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_engaged,(char (*) [8])"shading");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9e8);
  if (!bVar1) {
    testing::Message::Message(&local_9f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_9e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x47,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_9f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_9f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9e8);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[14],_nullptr>
            ((EqHelper *)local_a08,"product.manufacturer","\"Solar Comfort\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&product.productType.field_2 + 8),(char (*) [14])"Solar Comfort");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a08);
  if (!bVar1) {
    testing::Message::Message(&local_a10);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a08);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x48,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_a10);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_a10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a08);
  std::optional<double>::optional(&local_a38);
  testing::internal::EqHelper::Compare<std::optional<double>,_std::optional<double>,_nullptr>
            ((EqHelper *)local_a28,"product.thickness","std::optional<double>()",
             (optional<double> *)&product.cgdbShadeMaterialId,&local_a38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a28);
  if (!bVar1) {
    testing::Message::Message(&local_a40);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x49,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_a40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_a40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a28);
  std::optional<double>::optional(&local_a68);
  testing::internal::EqHelper::Compare<std::optional<double>,_std::optional<double>,_nullptr>
            ((EqHelper *)local_a58,"product.IRTransmittance","std::optional<double>()",
             (optional<double> *)
             &product.conductivity.super__Optional_base<double,_true,_true>._M_payload.
              super__Optional_payload_base<double>._M_engaged,&local_a68);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a58);
  if (!bVar1) {
    testing::Message::Message(&local_a70);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a58);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x4b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_a70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_a70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a58);
  std::optional<double>::optional(&local_a98);
  testing::internal::EqHelper::Compare<std::optional<double>,_std::optional<double>,_nullptr>
            ((EqHelper *)local_a88,"product.frontEmissivity","std::optional<double>()",
             (optional<double> *)
             &product.IRTransmittance.super__Optional_base<double,_true,_true>._M_payload.
              super__Optional_payload_base<double>._M_engaged,&local_a98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a88);
  if (!bVar1) {
    testing::Message::Message(&local_aa0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x4c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_aa0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_aa0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a88);
  std::optional<double>::optional(&local_ac8);
  testing::internal::EqHelper::Compare<std::optional<double>,_std::optional<double>,_nullptr>
            ((EqHelper *)local_ab8,"product.backEmissivity","std::optional<double>()",
             (optional<double> *)
             &product.frontEmissivity.super__Optional_base<double,_true,_true>._M_payload.
              super__Optional_payload_base<double>._M_engaged,&local_ac8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ab8);
  if (!bVar1) {
    testing::Message::Message(&local_ad0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ab8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x4d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_ad0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_ad0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ab8);
  local_ae9 = std::
              optional<std::variant<std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>,_OpticsParser::DualBandBSDF>_>
              ::has_value((optional<std::variant<std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>,_OpticsParser::DualBandBSDF>_>
                           *)&product.wavelengthUnit.
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_engaged);
  local_aea = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_ae8,"product.measurements.has_value()","false",&local_ae9,&local_aea)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ae8);
  if (!bVar1) {
    testing::Message::Message(&local_af8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ae8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &geometry.
                super___shared_ptr<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x4e,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &geometry.
                super___shared_ptr<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,&local_af8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &geometry.
                super___shared_ptr<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    testing::Message::~Message(&local_af8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ae8);
  std::dynamic_pointer_cast<OpticsParser::PerforatedGeometry,OpticsParser::ProductGeometry>
            ((shared_ptr<OpticsParser::ProductGeometry> *)&gtest_ar_8.message_);
  peVar3 = std::
           __shared_ptr_access<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar_8.message_);
  local_b28 = 1.69;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_b20,"geometry->spacingX","1.69",&peVar3->spacingX,&local_b28);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b20);
  if (!bVar1) {
    testing::Message::Message(&local_b30);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x51,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_b30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_b30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b20);
  peVar3 = std::
           __shared_ptr_access<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar_8.message_);
  local_b50 = 1.69;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_b48,"geometry->spacingY","1.69",&peVar3->spacingY,&local_b50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b48);
  if (!bVar1) {
    testing::Message::Message(&local_b58);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b48);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x52,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_b58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_b58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b48);
  peVar3 = std::
           __shared_ptr_access<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar_8.message_);
  local_b78 = 0.58;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_b70,"geometry->dimensionX","0.58",&peVar3->dimensionX,&local_b78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b70);
  if (!bVar1) {
    testing::Message::Message(&local_b80);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x53,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_b80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_b80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b70);
  peVar3 = std::
           __shared_ptr_access<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar_8.message_);
  local_ba0 = 6.35;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_b98,"geometry->dimensionY","6.35",&peVar3->dimensionY,&local_ba0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b98);
  if (!bVar1) {
    testing::Message::Message(&local_ba8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x54,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_ba8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_ba8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b98);
  peVar3 = std::
           __shared_ptr_access<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar_8.message_);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[9],_nullptr>
            ((EqHelper *)local_bc0,"geometry->perforationType","\"Circular\"",
             &peVar3->perforationType,(char (*) [9])"Circular");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bc0);
  if (!bVar1) {
    testing::Message::Message(&local_bc8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_bc0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &material.super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x55,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &material.super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,&local_bc8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &material.super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    testing::Message::~Message(&local_bc8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_bc0);
  std::shared_ptr<OpticsParser::ProductData>::shared_ptr
            ((shared_ptr<OpticsParser::ProductData> *)&gtest_ar_13.message_,
             (shared_ptr<OpticsParser::ProductData> *)
             &product.thicknessUnit.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_engaged);
  peVar4 = std::
           __shared_ptr_access<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar_13.message_);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[21],_nullptr>
            ((EqHelper *)local_bf0,"material->name","\"SCRadiantBarrier.txt\"",&peVar4->name,
             (char (*) [21])"SCRadiantBarrier.txt");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bf0);
  if (!bVar1) {
    testing::Message::Message(&local_bf8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_bf0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x57,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_bf8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_bf8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_bf0);
  peVar4 = std::
           __shared_ptr_access<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar_13.message_);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[9],_nullptr>
            ((EqHelper *)local_c10,"material->productType","\"material\"",&peVar4->productType,
             (char (*) [9])0x242807);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c10);
  if (!bVar1) {
    testing::Message::Message(&local_c18);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c10);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x58,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_c18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_c18);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c10);
  peVar4 = std::
           __shared_ptr_access<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar_13.message_);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[14],_nullptr>
            ((EqHelper *)local_c30,"material->manufacturer","\"Solar Comfort\"",
             &peVar4->manufacturer,(char (*) [14])"Solar Comfort");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c30);
  if (!bVar1) {
    testing::Message::Message(&local_c38);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x59,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_c38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_c38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c30);
  peVar4 = std::
           __shared_ptr_access<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar_13.message_);
  local_c58 = 0.23;
  testing::internal::EqHelper::Compare<std::optional<double>,_double,_nullptr>
            ((EqHelper *)local_c50,"material->thickness","0.23",&peVar4->thickness,&local_c58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c50);
  if (!bVar1) {
    testing::Message::Message(&local_c60);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c50);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x5a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_c60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_c60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c50);
  peVar4 = std::
           __shared_ptr_access<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar_13.message_);
  local_c80 = 0.0;
  testing::internal::EqHelper::Compare<std::optional<double>,_double,_nullptr>
            ((EqHelper *)local_c78,"material->IRTransmittance","0.0",&peVar4->IRTransmittance,
             &local_c80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c78);
  if (!bVar1) {
    testing::Message::Message(&local_c88);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x5b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,&local_c88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(&local_c88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c78);
  peVar4 = std::
           __shared_ptr_access<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar_13.message_);
  local_ca8 = 0.863;
  testing::internal::EqHelper::Compare<std::optional<double>,_double,_nullptr>
            ((EqHelper *)local_ca0,"material->frontEmissivity","0.863",&peVar4->frontEmissivity,
             &local_ca8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ca0);
  if (!bVar1) {
    testing::Message::Message(&local_cb0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ca0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x5c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_cb0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_cb0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ca0);
  peVar4 = std::
           __shared_ptr_access<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar_13.message_);
  local_cd0 = 0.84;
  testing::internal::EqHelper::Compare<std::optional<double>,_double,_nullptr>
            ((EqHelper *)local_cc8,"material->backEmissivity","0.84",&peVar4->backEmissivity,
             &local_cd0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cc8);
  if (!bVar1) {
    testing::Message::Message(&local_cd8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_cc8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x5d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,&local_cd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(&local_cd8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_cc8);
  peVar4 = std::
           __shared_ptr_access<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar_13.message_);
  local_cf8 = 0.12;
  testing::internal::EqHelper::Compare<std::optional<double>,_double,_nullptr>
            ((EqHelper *)local_cf0,"material->conductivity","0.12",&peVar4->conductivity,&local_cf8)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cf0);
  if (!bVar1) {
    testing::Message::Message(&local_d00);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_cf0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x5e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,&local_d00);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
    testing::Message::~Message(&local_d00);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_cf0);
  peVar4 = std::
           __shared_ptr_access<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar_13.message_);
  local_d19 = std::
              optional<std::variant<std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>,_OpticsParser::DualBandBSDF>_>
              ::has_value(&peVar4->measurements);
  local_d1a = true;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_d18,"material->measurements.has_value()","true",&local_d19,&local_d1a
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d18);
  if (!bVar1) {
    testing::Message::Message(&local_d28);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d18);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&materialMeasurements,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x5f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&materialMeasurements,&local_d28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&materialMeasurements);
    testing::Message::~Message(&local_d28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d18);
  peVar4 = std::
           __shared_ptr_access<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar_13.message_);
  __v = std::
        optional<std::variant<std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>,_OpticsParser::DualBandBSDF>_>
        ::value(&peVar4->measurements);
  gtest_ar_22.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )std::
         get<std::vector<OpticsParser::WLData,std::allocator<OpticsParser::WLData>>,std::vector<OpticsParser::WLData,std::allocator<OpticsParser::WLData>>,OpticsParser::DualBandBSDF>
                   (__v);
  local_d50 = std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>::size
                        ((vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_> *)
                         gtest_ar_22.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  local_d54 = 0x1b9;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_d48,"materialMeasurements.size()","441",&local_d50,&local_d54);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d48);
  if (!bVar1) {
    testing::Message::Message(&local_d60);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d48);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x62,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,&local_d60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
    testing::Message::~Message(&local_d60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d48);
  pvVar5 = std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>::operator[]
                     ((vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_> *)
                      gtest_ar_22.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl,0);
  local_d80 = 0.3;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_d78,"materialMeasurements[0].wavelength","0.3",&pvVar5->wavelength,
             &local_d80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d78);
  if (!bVar1) {
    testing::Message::Message(&local_d88);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_24.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,99,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_24.message_,&local_d88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_24.message_);
    testing::Message::~Message(&local_d88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d78);
  pvVar5 = std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>::operator[]
                     ((vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_> *)
                      gtest_ar_22.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl,0);
  pMVar6 = std::optional<OpticsParser::MeasurementComponent>::value(&pvVar5->directComponent);
  local_da8 = 0.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_da0,"materialMeasurements[0].directComponent.value().tf","0.0",
             &pMVar6->tf,&local_da8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_da0);
  if (!bVar1) {
    testing::Message::Message(&local_db0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_da0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_25.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,100,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_25.message_,&local_db0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_25.message_);
    testing::Message::~Message(&local_db0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_da0);
  pvVar5 = std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>::operator[]
                     ((vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_> *)
                      gtest_ar_22.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl,0);
  pMVar6 = std::optional<OpticsParser::MeasurementComponent>::value(&pvVar5->directComponent);
  local_dd0 = 0.0794;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_dc8,"materialMeasurements[0].directComponent.value().rf","0.0794",
             &pMVar6->rf,&local_dd0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_dc8);
  if (!bVar1) {
    testing::Message::Message(&local_dd8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_dc8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_26.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x65,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_26.message_,&local_dd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_26.message_);
    testing::Message::~Message(&local_dd8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_dc8);
  pvVar5 = std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>::operator[]
                     ((vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_> *)
                      gtest_ar_22.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl,0);
  pMVar6 = std::optional<OpticsParser::MeasurementComponent>::value(&pvVar5->directComponent);
  local_df8 = 0.0674;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_df0,"materialMeasurements[0].directComponent.value().rb","0.0674",
             &pMVar6->rb,&local_df8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_df0);
  if (!bVar1) {
    testing::Message::Message(&local_e00);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_df0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_27.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x66,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_27.message_,&local_e00);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_27.message_);
    testing::Message::~Message(&local_e00);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_df0);
  pvVar5 = std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>::operator[]
                     ((vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_> *)
                      gtest_ar_22.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl,0x1b8);
  local_e20 = 2.5;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_e18,"materialMeasurements[440].wavelength","2.50",&pvVar5->wavelength
             ,&local_e20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e18);
  if (!bVar1) {
    testing::Message::Message(&local_e28);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e18);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_28.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x67,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_28.message_,&local_e28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_28.message_);
    testing::Message::~Message(&local_e28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e18);
  pvVar5 = std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>::operator[]
                     ((vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_> *)
                      gtest_ar_22.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl,0x1b8);
  pMVar6 = std::optional<OpticsParser::MeasurementComponent>::value(&pvVar5->directComponent);
  local_e48 = 0.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_e40,"materialMeasurements[440].directComponent.value().tf","0.0",
             &pMVar6->tf,&local_e48);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e40);
  if (!bVar1) {
    testing::Message::Message(&local_e50);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x68,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29.message_,&local_e50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29.message_);
    testing::Message::~Message(&local_e50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e40);
  pvVar5 = std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>::operator[]
                     ((vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_> *)
                      gtest_ar_22.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl,0x1b8);
  pMVar6 = std::optional<OpticsParser::MeasurementComponent>::value(&pvVar5->directComponent);
  local_e70 = 0.6568;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_e68,"materialMeasurements[440].directComponent.value().rf","0.6568",
             &pMVar6->rf,&local_e70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e68);
  if (!bVar1) {
    testing::Message::Message(&local_e78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_30.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x69,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_30.message_,&local_e78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_30.message_);
    testing::Message::~Message(&local_e78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e68);
  pvVar5 = std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>::operator[]
                     ((vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_> *)
                      gtest_ar_22.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl,0x1b8);
  pMVar6 = std::optional<OpticsParser::MeasurementComponent>::value(&pvVar5->directComponent);
  local_e98 = 0.48;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_e90,"materialMeasurements[440].directComponent.value().rb","0.48",
             &pMVar6->rb,&local_e98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e90);
  if (!bVar1) {
    testing::Message::Message(&local_ea0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e90);
    testing::internal::AssertHelper::AssertHelper
              (&local_ea8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x6a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_ea8,&local_ea0);
    testing::internal::AssertHelper::~AssertHelper(&local_ea8);
    testing::Message::~Message(&local_ea0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e90);
  std::shared_ptr<OpticsParser::ProductData>::~shared_ptr
            ((shared_ptr<OpticsParser::ProductData> *)&gtest_ar_13.message_);
  std::shared_ptr<OpticsParser::PerforatedGeometry>::~shared_ptr
            ((shared_ptr<OpticsParser::PerforatedGeometry> *)&gtest_ar_8.message_);
  OpticsParser::ProductData::~ProductData((ProductData *)local_998);
  std::filesystem::__cxx11::path::~path((path *)local_40);
  testing::ScopedTrace::~ScopedTrace((ScopedTrace *)&product_path.field_0x27);
  return;
}

Assistant:

TEST(TestLoadIGSDBJSONFromDisk, TestLoadIGSDBPerforatedScreenShadingLayerJSON)
{
    SCOPED_TRACE("Begin Test: Load IGSDB perforated shading layer json format.");
    std::filesystem::path product_path(TEST_DATA_DIR);
    product_path /= "products";
    product_path /= "igsdb_v1_perforated.json";

    OpticsParser::Parser parser;

	auto product = parser.parseJSONFile(product_path.string());

    //    EXPECT_EQ(product.nfrcid.value(), 102);
    EXPECT_EQ(product.name, "Solar Comfort Radiant Barrier");
    EXPECT_EQ(product.productType, "shading");
    EXPECT_EQ(product.manufacturer, "Solar Comfort");
    EXPECT_EQ(product.thickness, std::optional<double>());
    // TODO EXPECT_EQ(product.conductivity, 1.0);
    EXPECT_EQ(product.IRTransmittance, std::optional<double>());
    EXPECT_EQ(product.frontEmissivity, std::optional<double>());
    EXPECT_EQ(product.backEmissivity, std::optional<double>());
    EXPECT_EQ(product.measurements.has_value(), false);
    auto geometry = std::dynamic_pointer_cast<OpticsParser::PerforatedGeometry>(
      product.geometry);
    EXPECT_EQ(geometry->spacingX, 1.69);
    EXPECT_EQ(geometry->spacingY, 1.69);
    EXPECT_EQ(geometry->dimensionX, 0.58);
    EXPECT_EQ(geometry->dimensionY, 6.35);
    EXPECT_EQ(geometry->perforationType, "Circular");
    auto material = product.materialDefinition;
    EXPECT_EQ(material->name, "SCRadiantBarrier.txt");
    EXPECT_EQ(material->productType, "material");
    EXPECT_EQ(material->manufacturer, "Solar Comfort");
    EXPECT_EQ(material->thickness, 0.23);
    EXPECT_EQ(material->IRTransmittance, 0.0);
    EXPECT_EQ(material->frontEmissivity, 0.863);
    EXPECT_EQ(material->backEmissivity, 0.84);
    EXPECT_EQ(material->conductivity, 0.12);
    EXPECT_EQ(material->measurements.has_value(), true);
    auto & materialMeasurements =
      std::get<std::vector<OpticsParser::WLData>>(material->measurements.value());
    EXPECT_EQ(materialMeasurements.size(), 441);
    EXPECT_EQ(materialMeasurements[0].wavelength, 0.3);
    EXPECT_EQ(materialMeasurements[0].directComponent.value().tf, 0.0);
    EXPECT_EQ(materialMeasurements[0].directComponent.value().rf, 0.0794);
    EXPECT_EQ(materialMeasurements[0].directComponent.value().rb, 0.0674);
    EXPECT_EQ(materialMeasurements[440].wavelength, 2.50);
    EXPECT_EQ(materialMeasurements[440].directComponent.value().tf, 0.0);
    EXPECT_EQ(materialMeasurements[440].directComponent.value().rf, 0.6568);
    EXPECT_EQ(materialMeasurements[440].directComponent.value().rb, 0.48);
}